

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManMuxProfiling(Gia_Man_t *p)

{
  Abc_Nam_t *p_00;
  Gia_Obj_t *p_01;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  Vec_Int_t *p_02;
  abctime aVar8;
  char *pcVar9;
  bool bVar10;
  int local_74;
  int Entry;
  int k;
  char *pTemp_1;
  char *pTemp;
  abctime clk;
  int nDigitsId;
  int iStructId;
  int fFound;
  int Counter;
  int i;
  Vec_Int_t *vVec;
  Vec_Int_t *vFans;
  Vec_Str_t *vStr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Mux_Man_t *pMan;
  Gia_Man_t *p_local;
  
  pMan = (Mux_Man_t *)p;
  aVar7 = Abc_Clock();
  pObj = (Gia_Obj_t *)Gia_ManDupMuxes((Gia_Man_t *)pMan,2);
  uVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
  iVar2 = Abc_Base10Log(uVar1);
  pNew = (Gia_Man_t *)Mux_ManAlloc((Gia_Man_t *)pObj);
  Gia_ManLevelNum((Gia_Man_t *)pObj);
  Gia_ManCreateRefs((Gia_Man_t *)pObj);
  fFound = 0;
  while( true ) {
    iVar6 = fFound;
    iVar3 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
    bVar10 = false;
    if (iVar6 < iVar3) {
      vStr = (Vec_Str_t *)Gia_ManCo((Gia_Man_t *)pObj,fFound);
      bVar10 = vStr != (Vec_Str_t *)0x0;
    }
    if (!bVar10) break;
    Gia_ObjRefFanin0Inc((Gia_Man_t *)pObj,(Gia_Obj_t *)vStr);
    fFound = fFound + 1;
  }
  vFans = (Vec_Int_t *)Vec_StrAlloc(1000);
  vVec = Gia_ManFirstFanouts((Gia_Man_t *)pObj);
  fFound = 0;
  do {
    bVar10 = false;
    if (fFound < *(int *)(pObj + 2)) {
      vStr = (Vec_Str_t *)Gia_ManObj((Gia_Man_t *)pObj,fFound);
      bVar10 = vStr != (Vec_Str_t *)0x0;
    }
    if (!bVar10) {
      Vec_StrFree((Vec_Str_t *)vFans);
      Vec_IntFree(vVec);
      printf("MUX structure profile for AIG \"%s\":\n",pMan->pGia);
      uVar1 = Gia_ManMuxNum((Gia_Man_t *)pObj);
      uVar5 = Vec_WecSizeSize(*(Vec_Wec_t **)&pNew->nRegs);
      iVar2 = Vec_WecSize(*(Vec_Wec_t **)&pNew->nRegs);
      iVar6 = Abc_NamMemUsed((Abc_Nam_t *)pNew->pSpec);
      printf("Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ",
             ((double)iVar6 * 1.0) / 1048576.0,(ulong)uVar1,(ulong)uVar5,(ulong)(iVar2 - 1));
      aVar8 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar8 - aVar7);
      iVar2 = Gia_ManMuxProfile((Mux_Man_t *)pNew,0);
      if (iVar2 != 0) {
        Gia_ManMuxProfile((Mux_Man_t *)pNew,1);
        printf("The first %d structures: \n",10);
        fFound = 1;
        while( true ) {
          iVar2 = fFound;
          iVar6 = Vec_WecSize(*(Vec_Wec_t **)&pNew->nRegs);
          iVar6 = Abc_MinInt(iVar6,10);
          if (iVar6 <= iVar2) break;
          _Counter = Vec_WecEntry(*(Vec_Wec_t **)&pNew->nRegs,fFound);
          pcVar9 = Abc_NamStr((Abc_Nam_t *)pNew->pSpec,fFound);
          printf("%5d : ",(ulong)(uint)fFound);
          uVar1 = Vec_IntSize(_Counter);
          printf("Occur = %4d   ",(ulong)uVar1);
          uVar1 = atoi(pcVar9);
          printf("Size = %4d   ",(ulong)uVar1);
          printf("%s\n",pcVar9);
          fFound = fFound + 1;
        }
        iStructId = 0;
        for (fFound = 1; iVar2 = fFound, iVar6 = Vec_WecSize(*(Vec_Wec_t **)&pNew->nRegs),
            iVar2 < iVar6; fFound = fFound + 1) {
          _Counter = Vec_WecEntry(*(Vec_Wec_t **)&pNew->nRegs,fFound);
          pcVar9 = Abc_NamStr((Abc_Nam_t *)pNew->pSpec,fFound);
          iVar2 = Vec_IntSize(_Counter);
          if ((5 < iVar2) && (iVar6 = atoi(pcVar9), iVar2 = fFound, 5 < iVar6)) {
            uVar1 = atoi(pcVar9);
            uVar5 = Vec_IntSize(_Counter);
            printf("For example, structure %d has %d MUXes and bit-width %d:\n",(ulong)(uint)iVar2,
                   (ulong)uVar1,(ulong)uVar5);
            for (local_74 = 0; iVar2 = Vec_IntSize(_Counter), local_74 < iVar2;
                local_74 = local_74 + 1) {
              iVar2 = Vec_IntEntry(_Counter,local_74);
              Gia_MuxStructPrint((Gia_Man_t *)pObj,iVar2);
            }
            iStructId = iStructId + 1;
            if (iStructId == 5) break;
          }
        }
      }
      Mux_ManFree((Mux_Man_t *)pNew);
      Gia_ManStop((Gia_Man_t *)pObj);
      return;
    }
    iVar6 = Gia_ObjIsMuxId((Gia_Man_t *)pObj,fFound);
    if (iVar6 != 0) {
      iVar6 = Gia_ObjRefNumId((Gia_Man_t *)pObj,fFound);
      p_01 = pObj;
      if (iVar6 == 1) {
        iVar6 = Vec_IntEntry(vVec,fFound);
        iVar6 = Gia_ObjIsMuxId((Gia_Man_t *)p_01,iVar6);
        if (iVar6 != 0) goto LAB_00229e00;
      }
      iStructId = Gia_MuxStructDump((Gia_Man_t *)pObj,fFound,(Vec_Str_t *)vFans,3,iVar2);
      if (iStructId != 1) {
        p_00 = (Abc_Nam_t *)pNew->pSpec;
        pcVar9 = Vec_StrArray((Vec_Str_t *)vFans);
        iVar6 = Abc_NamStrFindOrAdd(p_00,pcVar9,&nDigitsId);
        if (nDigitsId == 0) {
          Vec_WecPushLevel(*(Vec_Wec_t **)&pNew->nRegs);
        }
        iVar3 = Abc_NamObjNumMax((Abc_Nam_t *)pNew->pSpec);
        iVar4 = Vec_WecSize(*(Vec_Wec_t **)&pNew->nRegs);
        if (iVar3 != iVar4) {
          __assert_fail("Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                        ,0x26f,"void Gia_ManMuxProfiling(Gia_Man_t *)");
        }
        p_02 = Vec_WecEntry(*(Vec_Wec_t **)&pNew->nRegs,iVar6);
        Vec_IntPush(p_02,fFound);
      }
    }
LAB_00229e00:
    fFound = fFound + 1;
  } while( true );
}

Assistant:

void Gia_ManMuxProfiling( Gia_Man_t * p )
{
    Mux_Man_t * pMan;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStr;
    Vec_Int_t * vFans, * vVec;
    int i, Counter, fFound, iStructId, nDigitsId;
    abctime clk = Abc_Clock();

    pNew = Gia_ManDupMuxes( p, 2 );
    nDigitsId = Abc_Base10Log( Gia_ManObjNum(pNew) );

    pMan = Mux_ManAlloc( pNew );
     
    Gia_ManLevelNum( pNew );
    Gia_ManCreateRefs( pNew );
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjRefFanin0Inc( pNew, pObj );

    vStr = Vec_StrAlloc( 1000 );
    vFans = Gia_ManFirstFanouts( pNew );
    Gia_ManForEachMux( pNew, pObj, i )
    {
        // skip MUXes in the middle of the tree (which have only one MUX fanout)
        if ( Gia_ObjRefNumId(pNew, i) == 1 && Gia_ObjIsMuxId(pNew, Vec_IntEntry(vFans, i)) )
            continue;
        // this node is the root of the MUX structure - create hash key
        Counter = Gia_MuxStructDump( pNew, i, vStr, 3, nDigitsId );
        if ( Counter == 1 )
            continue;
        iStructId = Abc_NamStrFindOrAdd( pMan->pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound )
            Vec_WecPushLevel( pMan->vTops );
        assert( Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops) );
        Vec_IntPush( Vec_WecEntry(pMan->vTops, iStructId), i );
    }
    Vec_StrFree( vStr );
    Vec_IntFree( vFans );

    printf( "MUX structure profile for AIG \"%s\":\n", p->pName );
    printf( "Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ", 
        Gia_ManMuxNum(pNew), Vec_WecSizeSize(pMan->vTops), Vec_WecSize(pMan->vTops)-1, 
        1.0*Abc_NamMemUsed(pMan->pNames)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( Gia_ManMuxProfile(pMan, 0) )
    {
        Gia_ManMuxProfile( pMan, 1 );

        // short the first ones
        printf( "The first %d structures: \n", 10 );
        Vec_WecForEachLevelStartStop( pMan->vTops, vVec, i, 1, Abc_MinInt(Vec_WecSize(pMan->vTops), 10) )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(vVec) );
            printf( "Size = %4d   ", atoi(pTemp) );
            printf( "%s\n", pTemp );
        }

        // print trees for the first one
        Counter = 0;
        Vec_WecForEachLevelStart( pMan->vTops, vVec, i, 1 )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            if ( Vec_IntSize(vVec) > 5 && atoi(pTemp) > 5 )
            {
                int k, Entry;
                printf( "For example, structure %d has %d MUXes and bit-width %d:\n", i, atoi(pTemp), Vec_IntSize(vVec) );
                Vec_IntForEachEntry( vVec, Entry, k )
                    Gia_MuxStructPrint( pNew, Entry );
                if ( ++Counter == 5 )
                    break;
            }
        }
    }

    Mux_ManFree( pMan );
    Gia_ManStop( pNew );
}